

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 GenStateCompileChunk(jx9_gen_state *pGen,sxi32 iFlags)

{
  int iVar1;
  SyToken *pSVar2;
  bool bVar3;
  int iVar4;
  sxi32 sVar5;
  long lVar6;
  code *pcVar7;
  
  iVar4 = 0;
  do {
    pSVar2 = pGen->pIn;
    if (pGen->pEnd <= pSVar2) {
      return iVar4;
    }
    if ((pSVar2->nType & 4) == 0) {
      pcVar7 = (code *)0x0;
    }
    else {
      iVar1 = *(int *)&pSVar2->pUserData;
      lVar6 = 8;
      do {
        if (*(int *)((long)&aOpTable[0x31].iAssoc + lVar6) == iVar1) {
          pcVar7 = *(code **)((long)&aLangConstruct[0].nID + lVar6);
          goto LAB_0012485e;
        }
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0xe8);
      pcVar7 = (code *)0x0;
LAB_0012485e:
      bVar3 = true;
      if (pcVar7 == (code *)0x0) {
        if ((3 < iVar1 - 0xdU) && (iVar1 != 2)) {
          bVar3 = false;
          iVar4 = jx9GenCompileError(pGen,1,pSVar2->nLine,"Syntax error: Unexpected keyword \'%z\'")
          ;
          if (iVar4 != -10) {
            pcVar7 = jx9ErrorRecover;
            bVar3 = true;
            goto LAB_0012489b;
          }
          iVar4 = -10;
        }
        pcVar7 = (code *)0x0;
      }
LAB_0012489b:
      if (!bVar3) {
        return iVar4;
      }
    }
    if (pcVar7 == (code *)0x0) {
      sVar5 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
      iVar4 = -3;
      if (sVar5 != -3) {
        jx9VmEmitInstr(pGen->pVm,0xb,1,0,(void *)0x0,(sxu32 *)0x0);
        iVar4 = sVar5;
      }
    }
    else {
      iVar4 = (*pcVar7)();
    }
    if (iVar4 == -10) {
      return -10;
    }
    pSVar2 = pGen->pIn;
    while ((pSVar2 < pGen->pEnd && ((pSVar2->nType & 0x40000) != 0))) {
      pGen->pIn = pSVar2 + 1;
      pSVar2 = pSVar2 + 1;
    }
    if ((iFlags & 1U) != 0) {
      return iVar4;
    }
  } while( true );
}

Assistant:

static sxi32 GenStateCompileChunk(
	jx9_gen_state *pGen, /* Code generator state */
	sxi32 iFlags             /* Compile flags */
	)
{
	ProcLangConstruct xCons;
	sxi32 rc;
	rc = SXRET_OK; /* Prevent compiler warning */
	for(;;){
		if( pGen->pIn >= pGen->pEnd ){
			/* No more input to process */
			break;
		}
		xCons = 0;
		if( pGen->pIn->nType & JX9_TK_KEYWORD ){
			sxu32 nKeyword = (sxu32)SX_PTR_TO_INT(pGen->pIn->pUserData);
			/* Try to extract a language construct handler */
			xCons = GenStateGetStatementHandler(nKeyword);
			if( xCons == 0 && !jx9IsLangConstruct(nKeyword) ){
				rc = jx9GenCompileError(pGen, E_ERROR, pGen->pIn->nLine,
					"Syntax error: Unexpected keyword '%z'",
					&pGen->pIn->sData);
				if( rc == SXERR_ABORT ){
					break;
				}
				/* Synchronize with the first semi-colon and avoid compiling
				 * this erroneous statement.
				 */
				xCons = jx9ErrorRecover;
			}
		}
		if( xCons == 0 ){
			/* Assume an expression an try to compile it */
			rc = jx9CompileExpr(&(*pGen), 0, 0);
			if(  rc != SXERR_EMPTY ){
				/* Pop l-value */
				jx9VmEmitInstr(pGen->pVm, JX9_OP_POP, 1, 0, 0, 0);
			}
		}else{
			/* Go compile the sucker */
			rc = xCons(&(*pGen));
		}
		if( rc == SXERR_ABORT ){
			/* Request to abort compilation */
			break;
		}
		/* Ignore trailing semi-colons ';' */
		while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_SEMI) ){
			pGen->pIn++;
		}
		if( iFlags & JX9_COMPILE_SINGLE_STMT ){
			/* Compile a single statement and return */
			break;
		}
		/* LOOP ONE */
		/* LOOP TWO */
		/* LOOP THREE */
		/* LOOP FOUR */
	}
	/* Return compilation status */
	return rc;
}